

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O3

void __thiscall XmlRpc::XmlRpcValue::assertTypeOrInvalid(XmlRpcValue *this,Type t)

{
  pointer *ppcVar1;
  string *psVar2;
  BinaryData *pBVar3;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->_type == TypeInvalid) {
    this->_type = t;
    switch(t) {
    case TypeString:
      pBVar3 = (BinaryData *)operator_new(0x20);
      (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&(pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      *(undefined1 *)
       &(pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage = 0;
      break;
    case TypeDateTime:
      pBVar3 = (BinaryData *)operator_new(0x38);
      (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pBVar3[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      pBVar3[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      pBVar3[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pBVar3[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      break;
    case TypeBase64:
    case TypeArray:
      pBVar3 = (BinaryData *)operator_new(0x18);
      (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      break;
    case TypeStruct:
      pBVar3 = (BinaryData *)operator_new(0x30);
      ppcVar1 = &(pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pBVar3[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      pBVar3[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppcVar1;
      pBVar3[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)ppcVar1;
      pBVar3[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      break;
    default:
      (this->_value).asDouble = 0.0;
      return;
    }
    (this->_value).asBinary = pBVar3;
  }
  else if (this->_type != t) {
    psVar2 = (string *)__cxa_allocate_exception(0x28);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"type error","");
    *(string **)psVar2 = psVar2 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar2,local_40,local_40 + local_38);
    *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
    __cxa_throw(psVar2,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
  }
  return;
}

Assistant:

void XmlRpcValue::assertTypeOrInvalid(Type t)
  {
    if (_type == TypeInvalid)
    {
      _type = t;
      switch (_type) {    // Ensure there is a valid value for the type
        case TypeString:   _value.asString = new std::string(); break;
        case TypeDateTime: _value.asTime = new struct tm();     break;
        case TypeBase64:   _value.asBinary = new BinaryData();  break;
        case TypeArray:    _value.asArray = new ValueArray();   break;
        case TypeStruct:   _value.asStruct = new ValueStruct(); break;
        default:           _value.asBinary = 0; break;
      }
    }
    else if (_type != t)
      throw XmlRpcException("type error");
  }